

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int yaml_emitter_write_tag_content
              (yaml_emitter_t *emitter,yaml_char_t *value,size_t length,int need_whitespace)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  yaml_char_t *pyVar5;
  char cVar6;
  byte *pbVar7;
  bool bVar8;
  
  if ((need_whitespace != 0) && (emitter->whitespace == 0)) {
    pyVar5 = (emitter->buffer).pointer;
    if ((emitter->buffer).end <= pyVar5 + 5) {
      iVar3 = yaml_emitter_flush(emitter);
      if (iVar3 == 0) {
        return 0;
      }
      pyVar5 = (emitter->buffer).pointer;
    }
    (emitter->buffer).pointer = pyVar5 + 1;
    *pyVar5 = ' ';
    emitter->column = emitter->column + 1;
  }
  pbVar7 = value + length;
  do {
    while( true ) {
      iVar3 = 1;
      if (value == pbVar7) {
        emitter->whitespace = 0;
        emitter->indention = 0;
        return 1;
      }
      bVar2 = *value;
      if (((((byte)(bVar2 - 0x30) < 10) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) ||
          ((bVar2 - 0x24 < 0x3c && ((0xa8000001ac00ffdU >> ((ulong)(bVar2 - 0x24) & 0x3f) & 1) != 0)
           ))) || (bVar2 == 0x7e)) break;
      if ((((char)bVar2 < '\0') && (iVar3 = 2, (bVar2 & 0xe0) != 0xc0)) &&
         (iVar3 = 3, (bVar2 & 0xf0) != 0xe0)) {
        iVar3 = (uint)((bVar2 & 0xf8) == 0xf0) << 2;
      }
      while (bVar8 = iVar3 != 0, iVar3 = iVar3 + -1, bVar8) {
        bVar2 = *value;
        pyVar5 = (emitter->buffer).pointer;
        if ((emitter->buffer).end <= pyVar5 + 5) {
          iVar4 = yaml_emitter_flush(emitter);
          if (iVar4 == 0) {
            return 0;
          }
          pyVar5 = (emitter->buffer).pointer;
        }
        (emitter->buffer).pointer = pyVar5 + 1;
        *pyVar5 = '%';
        emitter->column = emitter->column + 1;
        pyVar5 = (emitter->buffer).pointer;
        if ((emitter->buffer).end <= pyVar5 + 5) {
          iVar4 = yaml_emitter_flush(emitter);
          if (iVar4 == 0) {
            return 0;
          }
          pyVar5 = (emitter->buffer).pointer;
        }
        cVar6 = '7';
        if (bVar2 < 0xa0) {
          cVar6 = '0';
        }
        (emitter->buffer).pointer = pyVar5 + 1;
        *pyVar5 = cVar6 + (bVar2 >> 4);
        emitter->column = emitter->column + 1;
        pyVar5 = (emitter->buffer).pointer;
        if ((emitter->buffer).end <= pyVar5 + 5) {
          iVar4 = yaml_emitter_flush(emitter);
          if (iVar4 == 0) {
            return 0;
          }
          pyVar5 = (emitter->buffer).pointer;
        }
        value = value + 1;
        cVar6 = '7';
        if ((bVar2 & 0xf) < 10) {
          cVar6 = '0';
        }
        (emitter->buffer).pointer = pyVar5 + 1;
        *pyVar5 = cVar6 + (bVar2 & 0xf);
        emitter->column = emitter->column + 1;
      }
    }
    if ((emitter->buffer).end <= (emitter->buffer).pointer + 5) {
      iVar3 = yaml_emitter_flush(emitter);
      if (iVar3 == 0) {
        return 0;
      }
      bVar2 = *value;
    }
    if ((char)bVar2 < '\0') {
      if ((bVar2 & 0xe0) == 0xc0) {
        pbVar1 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pbVar1 + 1;
        *pbVar1 = bVar2;
        bVar2 = value[1];
        value = value + 2;
        goto LAB_001084cd;
      }
      if ((bVar2 & 0xf0) == 0xe0) {
        pbVar1 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pbVar1 + 1;
        *pbVar1 = bVar2;
        bVar2 = value[1];
        pbVar1 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pbVar1 + 1;
        *pbVar1 = bVar2;
        bVar2 = value[2];
        value = value + 3;
        goto LAB_001084cd;
      }
      if ((bVar2 & 0xf8) == 0xf0) {
        pbVar1 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pbVar1 + 1;
        *pbVar1 = bVar2;
        bVar2 = value[1];
        pbVar1 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pbVar1 + 1;
        *pbVar1 = bVar2;
        bVar2 = value[2];
        pbVar1 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pbVar1 + 1;
        *pbVar1 = bVar2;
        bVar2 = value[3];
        value = value + 4;
        goto LAB_001084cd;
      }
    }
    else {
      value = value + 1;
LAB_001084cd:
      pbVar1 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar1 + 1;
      *pbVar1 = bVar2;
    }
    emitter->column = emitter->column + 1;
  } while( true );
}

Assistant:

static int
yaml_emitter_write_tag_content(yaml_emitter_t *emitter,
        yaml_char_t *value, size_t length,
        int need_whitespace)
{
    yaml_string_t string;
    STRING_ASSIGN(string, value, length);

    if (need_whitespace && !emitter->whitespace) {
        if (!PUT(emitter, ' ')) return 0;
    }

    while (string.pointer != string.end) {
        if (IS_ALPHA(string)
                || CHECK(string, ';') || CHECK(string, '/')
                || CHECK(string, '?') || CHECK(string, ':')
                || CHECK(string, '@') || CHECK(string, '&')
                || CHECK(string, '=') || CHECK(string, '+')
                || CHECK(string, '$') || CHECK(string, ',')
                || CHECK(string, '_') || CHECK(string, '.')
                || CHECK(string, '~') || CHECK(string, '*')
                || CHECK(string, '\'') || CHECK(string, '(')
                || CHECK(string, ')') || CHECK(string, '[')
                || CHECK(string, ']')) {
            if (!WRITE(emitter, string)) return 0;
        }
        else {
            int width = WIDTH(string);
            unsigned int value;
            while (width --) {
                value = *(string.pointer++);
                if (!PUT(emitter, '%')) return 0;
                if (!PUT(emitter, (value >> 4)
                            + ((value >> 4) < 10 ? '0' : 'A' - 10)))
                    return 0;
                if (!PUT(emitter, (value & 0x0F)
                            + ((value & 0x0F) < 10 ? '0' : 'A' - 10)))
                    return 0;
            }
        }
    }

    emitter->whitespace = 0;
    emitter->indention = 0;

    return 1;
}